

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O1

void big_record_type_set(BigRecordType *rtype,int i,char *name,char *dtype,int nmemb)

{
  size_t sVar1;
  BigRecordField *pBVar2;
  char *pcVar3;
  ulong uVar4;
  size_t __n;
  
  uVar4 = (ulong)i;
  if (uVar4 < rtype->nfield) {
    pcVar3 = rtype->fields[uVar4].name;
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
  }
  else {
    sVar1 = uVar4 + 1;
    pBVar2 = (BigRecordField *)realloc(rtype->fields,sVar1 * 0x20);
    rtype->fields = pBVar2;
    memset(pBVar2 + rtype->nfield,0,(sVar1 - rtype->nfield) * 0x20);
    rtype->nfield = sVar1;
  }
  __n = 0;
  do {
    if (name[__n] == '\0') goto LAB_0010b04d;
    __n = __n + 1;
  } while (__n != 0x2000);
  __n = 0x2000;
LAB_0010b04d:
  pcVar3 = (char *)malloc(__n + 1);
  strncpy(pcVar3,name,__n);
  pcVar3[__n] = '\0';
  pBVar2 = rtype->fields;
  pBVar2[uVar4].name = pcVar3;
  strncpy(pBVar2[uVar4].dtype,dtype,8);
  rtype->fields[uVar4].nmemb = nmemb;
  return;
}

Assistant:

void
big_record_type_set(BigRecordType * rtype,
    int i,
    const char * name,
    const char * dtype,
    int nmemb)
{
    if(i >= rtype->nfield) {
        rtype->fields = realloc(rtype->fields,
            (i + 1) * sizeof(rtype->fields[0]));
        memset(&rtype->fields[rtype->nfield], 0,
            (i + 1 - rtype->nfield) * sizeof(rtype->fields[0]));
        rtype->nfield = i + 1;
    } else {
        if(rtype->fields[i].name) {
            free(rtype->fields[i].name);
        }
    }
    rtype->fields[i].name = _strdup(name);
    strncpy(rtype->fields[i].dtype, dtype, 8);
    rtype->fields[i].nmemb = nmemb;
}